

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldblib.c
# Opt level: O2

int db_setuservalue(lua_State *L)

{
  luaL_checktype(L,1,7);
  luaL_checkany(L,2);
  lua_settop(L,2);
  lua_setuservalue(L,1);
  return 1;
}

Assistant:

static int db_setuservalue (lua_State *L) {
  int n = (int)luaL_optinteger(L, 3, 1);
  luaL_checktype(L, 1, LUA_TUSERDATA);
  luaL_checkany(L, 2);
  lua_settop(L, 2);
  if (!lua_setiuservalue(L, 1, n))
    luaL_pushfail(L);
  return 1;
}